

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O3

void __thiscall
Js::JavascriptGenerator::MarkVisitKindSpecificPtrs
          (JavascriptGenerator *this,SnapshotExtractor *extractor)

{
  ScriptFunction *var;
  InterpreterStackFrame *pIVar1;
  ArgSlot AVar2;
  RegSlot RVar3;
  Var pvVar4;
  ulong uVar5;
  uint uVar6;
  
  var = (this->scriptFunction).ptr;
  if (var != (ScriptFunction *)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  pIVar1 = (this->frame).ptr;
  if (pIVar1 != (InterpreterStackFrame *)0x0) {
    RVar3 = FunctionBody::GetLocalsCount(*(FunctionBody **)(pIVar1 + 0x88));
    if (RVar3 != 0) {
      uVar5 = 0;
      do {
        pvVar4 = *(Var *)((this->frame).ptr + uVar5 * 8 + 0x160);
        if (pvVar4 != (Var)0x0) {
          TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar4);
        }
        uVar5 = uVar5 + 1;
      } while (RVar3 != uVar5);
    }
  }
  if ((this->args).Values != (Type)0x0) {
    uVar6 = *(uint *)&(this->args).Info;
    AVar2 = CallInfo::GetArgCountWithExtraArgs(uVar6 >> 0x18,uVar6 & 0xffffff);
    if (AVar2 != 0) {
      uVar6 = 0;
      do {
        pvVar4 = Arguments::operator[](&this->args,uVar6);
        if (pvVar4 != (Var)0x0) {
          TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar4);
        }
        uVar6 = uVar6 + 1;
      } while (AVar2 != uVar6);
    }
  }
  return;
}

Assistant:

void JavascriptGenerator::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    if (this->scriptFunction != nullptr)
    {
        extractor->MarkVisitVar(this->scriptFunction);
    }

    // frame is null when generator has been completed
    if (this->frame != nullptr)
    {
        // mark slot variables for traversal
        Js::RegSlot slotCount = this->frame->GetFunctionBody()->GetLocalsCount();
        for (Js::RegSlot i = 0; i < slotCount; i++)
        {
            Js::Var curr = this->frame->m_localSlots[i];
            if (curr != nullptr)
            {
                extractor->MarkVisitVar(curr);
            }
        }
    }

    // args.Values is null when generator has been completed
    if (this->args.Values != nullptr)
    {
        // mark argument variables for traversal
        uint32 argCount = this->args.GetArgCountWithExtraArgs();
        for (uint32 i = 0; i < argCount; i++)
        {
            Js::Var curr = this->args[i];
            if (curr != nullptr)
            {
                extractor->MarkVisitVar(curr);
            }
        }
    }
}